

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

void __thiscall
ot::commissioner::TokenManager::RequestToken
          (TokenManager *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  __0 *this_00;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  anon_class_40_2_1bbb15e4 onConnected;
  
  onConnected.this = this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function(&onConnected.aHandler,aHandler);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  this_00 = (__0 *)operator_new(0x28);
  RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::__0(this_00,&onConnected);
  pcStack_60 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:168:24)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:168:24)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)this_00;
  coap::CoapSecure::Connect(&this->mRegistrarClient,(ConnectHandler *)&local_78,aAddr,aPort);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base(&onConnected.aHandler.super__Function_base);
  return;
}

Assistant:

void TokenManager::RequestToken(Commissioner::Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [this, aHandler](const DtlsSession &, Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            SendTokenRequest(aHandler);
        }
    };

    mRegistrarClient.Connect(onConnected, aAddr, aPort);
}